

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  double *pdVar1;
  double local_50;
  double local_48;
  double local_40;
  double *cv;
  bool rc;
  ON_4dPoint *point_local;
  int j_local;
  int i_local;
  ON_NurbsSurface *this_local;
  
  cv._7_1_ = false;
  if ((((0 < this->m_dim) && (-1 < i)) && (-1 < j)) &&
     (((i < this->m_cv_count[0] && (j < this->m_cv_count[1])) &&
      (pdVar1 = CV(this,i,j), pdVar1 != (double *)0x0)))) {
    point->x = *pdVar1;
    if (this->m_dim < 2) {
      local_40 = 0.0;
    }
    else {
      local_40 = pdVar1[1];
    }
    point->y = local_40;
    if (this->m_dim < 3) {
      local_48 = 0.0;
    }
    else {
      local_48 = pdVar1[2];
    }
    point->z = local_48;
    if (this->m_is_rat == 0) {
      local_50 = 1.0;
    }
    else {
      local_50 = pdVar1[this->m_dim];
    }
    point->w = local_50;
    cv._7_1_ = true;
  }
  return cv._7_1_;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON_4dPoint& point ) const
{
  bool rc = false;
  if (m_dim > 0 && i >= 0 && j >= 0 && i < m_cv_count[0] && j < m_cv_count[1])
  {
    const double* cv = CV(i, j);
    if (cv) {
      point.x = cv[0];
      point.y = (m_dim > 1) ? cv[1] : 0.0;
      point.z = (m_dim > 2) ? cv[2] : 0.0;
      point.w = (m_is_rat) ? cv[m_dim] : 1.0;
      rc = true;
    }
  }
  return rc;
}